

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

EnumOptions * __thiscall
google::protobuf::EnumDescriptorProto::_internal_mutable_options(EnumDescriptorProto *this)

{
  EnumOptions *pEVar1;
  Arena *arena;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
  if (this->options_ != (EnumOptions *)0x0) {
    return this->options_;
  }
  arena = (Arena *)(this->_internal_metadata_).
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   .ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
  }
  pEVar1 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(arena);
  this->options_ = pEVar1;
  return pEVar1;
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::EnumOptions* EnumDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::EnumOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}